

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.h
# Opt level: O0

void __thiscall Js::Utf8SourceInfo::SetInDebugMode(Utf8SourceInfo *this,bool inDebugMode)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ISourceHolder **ppIVar5;
  undefined4 *puVar6;
  ISourceHolder *pIVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uchar **ppuVar8;
  bool local_29;
  nullptr_t local_20;
  byte local_11;
  Utf8SourceInfo *pUStack_10;
  bool inDebugMode_local;
  Utf8SourceInfo *this_local;
  
  local_11 = inDebugMode;
  pUStack_10 = this;
  bVar2 = GetIsLibraryCode(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                ,0x39,"(!GetIsLibraryCode())",
                                "Shouldn\'t call SetInDebugMode for Library code.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppIVar5 = Memory::WriteBarrierPtr::operator_cast_to_ISourceHolder__
                      ((WriteBarrierPtr *)&this->sourceHolder);
  if (*ppIVar5 == (ISourceHolder *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                ,0x3b,"(this->sourceHolder != nullptr)","We have no source holder.")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((byte)this->field_0xa8 >> 6 & 1) == (local_11 & 1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                ,0x3d,"(this->m_isInDebugMode != inDebugMode)",
                                "Why are we setting same value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  this->field_0xa8 = this->field_0xa8 & 0xbf | (local_11 & 1) << 6;
  pIVar7 = Memory::WriteBarrierPtr<Js::ISourceHolder>::operator->(&this->sourceHolder);
  uVar3 = (*(pIVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xb])();
  if ((uVar3 & 1) != 0) {
    if ((local_11 & 1) == 0) {
      this->field_0xa8 = this->field_0xa8 & 0xdf;
      local_20 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<const_unsigned_char>::operator=(&this->debugModeSource,&local_20);
      this->debugModeSourceLength = 0;
    }
    else {
      pIVar7 = Memory::WriteBarrierPtr<Js::ISourceHolder>::operator->(&this->sourceHolder);
      iVar4 = (*(pIVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[6])(pIVar7,L"Entering Debug Mode");
      Memory::WriteBarrierPtr<const_unsigned_char>::operator=
                (&this->debugModeSource,(uchar *)CONCAT44(extraout_var,iVar4));
      pIVar7 = Memory::WriteBarrierPtr<Js::ISourceHolder>::operator->(&this->sourceHolder);
      iVar4 = (*(pIVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(pIVar7,L"Entering Debug Mode");
      this->debugModeSourceLength = CONCAT44(extraout_var_00,iVar4);
      bVar2 = HasSource(this);
      local_29 = true;
      if (bVar2) {
        ppuVar8 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                            ((WriteBarrierPtr *)&this->debugModeSource);
        local_29 = *ppuVar8 == (uchar *)0x0;
      }
      this->field_0xa8 = this->field_0xa8 & 0xdf | local_29 << 5;
      EnsureLineOffsetCache(this);
    }
  }
  return;
}

Assistant:

void SetInDebugMode(bool inDebugMode)
        {
            AssertMsg(!GetIsLibraryCode(), "Shouldn't call SetInDebugMode for Library code.");

            AssertMsg(this->sourceHolder != nullptr, "We have no source holder.");

            AssertMsg(this->m_isInDebugMode != inDebugMode, "Why are we setting same value");

            this->m_isInDebugMode = inDebugMode;

            if (!this->sourceHolder->IsDeferrable())
            {
                return;
            }

            if (inDebugMode)
            {
                this->debugModeSource = this->sourceHolder->GetSource(_u("Entering Debug Mode"));
                this->debugModeSourceLength = this->sourceHolder->GetByteLength(_u("Entering Debug Mode"));
                this->debugModeSourceIsEmpty = !this->HasSource() || this->debugModeSource == nullptr;
                this->EnsureLineOffsetCache();
            }
            else
            {
                // If debugModeSourceIsEmpty is false, that means debugModeSource isn't nullptr or we aren't in debug mode.
                this->debugModeSourceIsEmpty = false;
                this->debugModeSource = nullptr;
                this->debugModeSourceLength = 0;
            }
        }